

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc32.cpp
# Opt level: O1

uint32_t crc32_bitwise(void *data,size_t length,uint32_t previousCrc32)

{
  uint uVar1;
  int iVar2;
  
  if (length != 0) {
    uVar1 = ~previousCrc32;
    do {
      length = length - 1;
      uVar1 = uVar1 ^ *data;
      iVar2 = 8;
      do {
        uVar1 = -(uVar1 & 1) & 0xedb88320 ^ uVar1 >> 1;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      data = (void *)((long)data + 1);
    } while (length != 0);
    previousCrc32 = ~uVar1;
  }
  return previousCrc32;
}

Assistant:

uint32_t crc32_bitwise(const void* data, size_t length, uint32_t previousCrc32 = 0)
{
  uint32_t crc = ~previousCrc32; // same as previousCrc32 ^ 0xFFFFFFFF
  const uint8_t* current = (const uint8_t*) data;

  while (length-- != 0)
  {
    crc ^= *current++;

    for (int j = 0; j < 8; j++)
    {
      // branch-free
      crc = (crc >> 1) ^ (-int32_t(crc & 1) & Polynomial);

      // branching, much slower:
      //if (crc & 1)
      //  crc = (crc >> 1) ^ Polynomial;
      //else
      //  crc =  crc >> 1;
    }
  }

  return ~crc; // same as crc ^ 0xFFFFFFFF
}